

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

fdb_compact_decision
cb_snapshot(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
           uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  int iVar1;
  timeval tStack_28;
  
  gettimeofday(&tStack_28,(__timezone_ptr_t)0x0);
  iVar1 = *(int *)((long)ctx + 0x10);
  *(int *)((long)ctx + 0x10) = iVar1 + -1;
  if (0 < iVar1) {
    if (kv_name != (char *)0x0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xfa7);
      __assert_fail("!kv_name",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xfa7,
                    "fdb_compact_decision cb_snapshot(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    _snapshot_check(*ctx,*(int *)((long)ctx + 8),*(int *)((long)ctx + 0xc));
    _snapshot_update_docs(fhandle,(cb_snapshot_args *)ctx);
    _snapshot_check(*ctx,*(int *)((long)ctx + 8),*(int *)((long)ctx + 0xc));
  }
  return 0;
}

Assistant:

static fdb_compact_decision cb_snapshot(fdb_file_handle *fhandle,
        fdb_compaction_status status, const char *kv_name,
        fdb_doc *doc, uint64_t old_offset, uint64_t new_offset,
        void *ctx)
{
    struct cb_snapshot_args *args = (struct cb_snapshot_args *)ctx;
    TEST_INIT();

    if (--args->niterations >= 0) {
        TEST_CHK(!kv_name);
        if (status == FDB_CS_BEGIN) {
            // first verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
            // update half docs
            _snapshot_update_docs(fhandle, args);
            // second verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
        } else { // if (status == FDB_CS_END)
            // first verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
            // update half docs
            _snapshot_update_docs(fhandle, args);
            // second verification
            _snapshot_check(args->handle, args->ndocs, args->nupdates);
        }
    }
    return 0;
}